

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawWallRevSubClamp4PalCommand::Execute
          (DrawWallRevSubClamp4PalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int pitch_00;
  uchar *dest_00;
  uint32_t *puVar3;
  uint32_t *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint32_t b;
  uint32_t a;
  int iStack_64;
  uint8_t pix;
  int i_1;
  int i;
  int skipped;
  int pitch;
  uint32_t dc_wall_iscale [4];
  uint32_t dc_wall_texturefrac [4];
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int bits;
  int count;
  uint8_t *dest;
  DrawerThread *thread_local;
  DrawWallRevSubClamp4PalCommand *this_local;
  
  dest_00 = (this->super_PalWall4Command)._dest;
  iVar2 = (this->super_PalWall4Command)._fracbits;
  puVar3 = (this->super_PalWall4Command)._srcblend;
  puVar4 = (this->super_PalWall4Command)._destblend;
  dc_wall_iscale[2] = (this->super_PalWall4Command)._texturefrac[0];
  dc_wall_iscale[3] = (this->super_PalWall4Command)._texturefrac[1];
  skipped = (this->super_PalWall4Command)._iscale[0];
  pitch = (this->super_PalWall4Command)._iscale[1];
  dc_wall_iscale[0] = (this->super_PalWall4Command)._iscale[2];
  dc_wall_iscale[1] = (this->super_PalWall4Command)._iscale[3];
  fg2rgb._4_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,
                            (this->super_PalWall4Command)._count);
  if (0 < fg2rgb._4_4_) {
    pitch_00 = (this->super_PalWall4Command)._pitch;
    iVar5 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    _bits = DrawerThread::dest_for_thread<unsigned_char>
                      (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,pitch_00,
                       dest_00);
    for (iStack_64 = 0; iStack_64 < 4; iStack_64 = iStack_64 + 1) {
      dc_wall_iscale[(long)iStack_64 + 2] =
           (&skipped)[iStack_64] * iVar5 + dc_wall_iscale[(long)iStack_64 + 2];
      (&skipped)[iStack_64] = thread->num_cores * (&skipped)[iStack_64];
    }
    do {
      for (a = 0; (int)a < 4; a = a + 1) {
        bVar1 = (this->super_PalWall4Command)._source[(int)a]
                [dc_wall_iscale[(long)(int)a + 2] >> ((byte)iVar2 & 0x1f)];
        if (bVar1 != 0) {
          uVar6 = (puVar4[_bits[(int)a]] | 0x40100400) -
                  puVar3[(this->super_PalWall4Command)._colormap[(int)a][bVar1]];
          uVar7 = uVar6 & 0x40100400;
          uVar6 = uVar7 - (uVar7 >> 5) & uVar6 | 0x1f07c1f;
          _bits[(int)a] = RGB32k.All[uVar6 & uVar6 >> 0xf];
        }
        dc_wall_iscale[(long)(int)a + 2] = (&skipped)[(int)a] + dc_wall_iscale[(long)(int)a + 2];
      }
      _bits = _bits + (this->super_PalWall4Command)._pitch;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
    } while (fg2rgb._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawWallRevSubClamp4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[_colormap[i][pix]];
					uint32_t b = a;

					b &= 0x40100400;
					b = b - (b >> 5);
					a &= b;
					a |= 0x01f07c1f;
					dest[i] = RGB32k.All[a & (a >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += _pitch;
		} while (--count);
	}